

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

Test * BuildTestImplicitOutput::Create(void)

{
  BuildTest *this;
  
  this = (BuildTest *)operator_new(0x4b8);
  BuildTest::BuildTest(this);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__BuildTest_001cd8e0;
  (this->super_BuildLogUser)._vptr_BuildLogUser = (_func_int **)&DAT_001cd920;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(BuildTest, ImplicitOutput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out $out.imp\n"
"build out | out.imp: touch in.txt\n"));
  fs_.Create("in.txt", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out.imp", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("touch out out.imp", command_runner_.commands_ran_[0]);
}